

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O1

int mbedtls_x509_write_sig(uchar **p,uchar *start,char *oid,size_t oid_len,uchar *sig,size_t size)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  puVar1 = *p;
  iVar4 = -0x6c;
  if ((start <= puVar1) && (size <= (ulong)((long)puVar1 - (long)start))) {
    *p = puVar1 + -size;
    memcpy(puVar1 + -size,sig,size);
    puVar1 = *p;
    if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
      *p = puVar1 + -1;
      puVar1[-1] = '\0';
      iVar2 = mbedtls_asn1_write_len(p,start,size + 1);
      iVar4 = iVar2;
      if (((-1 < iVar2) &&
          (iVar3 = mbedtls_asn1_write_tag(p,start,'\x03'), iVar4 = iVar3, -1 < iVar3)) &&
         (iVar4 = mbedtls_asn1_write_algorithm_identifier(p,start,oid,oid_len,0), -1 < iVar4)) {
        iVar4 = iVar2 + (int)(size + 1) + iVar3 + iVar4;
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_x509_write_sig( unsigned char **p, unsigned char *start,
                    const char *oid, size_t oid_len,
                    unsigned char *sig, size_t size )
{
    int ret;
    size_t len = 0;

    if( *p < start || (size_t)( *p - start ) < size )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = size;
    (*p) -= len;
    memcpy( *p, sig, len );

    if( *p - start < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    *--(*p) = 0;
    len += 1;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BIT_STRING ) );

    // Write OID
    //
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( p, start, oid,
                                                        oid_len, 0 ) );

    return( (int) len );
}